

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

string_t duckdb::UnaryLambdaWrapperWithNulls::
         Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                   (date_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  StrfTimeFormat *this;
  Vector *pVVar1;
  char *target;
  idx_t len;
  anon_union_16_2_67f50693_for_value aVar2;
  anon_union_16_2_67f50693_for_value local_38 [2];
  
  if ((input.days == -0x7fffffff) || (input.days == 0x7fffffff)) {
    pVVar1 = (Vector *)
             (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    Date::ToString_abi_cxx11_
              ((string *)&local_38[0].pointer,(Date *)(ulong)(uint)input.days,(date_t)(int32_t)idx);
    aVar2.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::AddString(pVVar1,(string *)&local_38[0].pointer);
    ::std::__cxx11::string::~string((string *)&local_38[0].pointer);
    local_38[0].pointer = aVar2.pointer;
  }
  else {
    this = (StrfTimeFormat *)(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    pVVar1 = (Vector *)StrfTimeFormat::GetLength(this,input,(dtime_t)0x0,0,(char *)0x0);
    local_38[0].pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::EmptyString
                   ((StringVector *)
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,pVVar1,len);
    target = local_38[0].pointer.prefix;
    if (0xc < local_38[0].pointer.length) {
      target = local_38[0].pointer.ptr;
    }
    StrfTimeFormat::FormatString(this,input,(dtime_t)0x0,target);
    string_t::Finalize((string_t *)&local_38[0].pointer);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38[0].pointer
  ;
}

Assistant:

static inline RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto fun = (FUNC *)dataptr;
		return (*fun)(input, mask, idx);
	}